

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O2

void __thiscall
rr::FragmentProcessor::executeStencilCompare
          (FragmentProcessor *this,int fragNdxOffset,int numSamplesPerFragment,
          Fragment *inputFragments,StencilState *stencilState,int numStencilBits,
          ConstPixelBufferAccess *stencilBuffer)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  bool *pbVar7;
  
  uVar3 = stencilState->ref;
  uVar5 = ~(-1 << ((byte)numStencilBits & 0x1f));
  if ((int)uVar3 < (int)uVar5) {
    uVar5 = uVar3;
  }
  uVar4 = 0;
  if (-1 < (int)uVar3) {
    uVar4 = uVar5;
  }
  switch(stencilState->func) {
  case TESTFUNC_NEVER:
    pbVar7 = &this->m_sampleRegister[0].stencilPassed;
    for (uVar6 = 0; uVar6 != 0x40; uVar6 = uVar6 + 1) {
      if (((SampleData *)(pbVar7 + -1))->isAlive == true) {
        uVar1 = (ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff;
        iVar2 = (int)((long)uVar1 / (long)numSamplesPerFragment) + fragNdxOffset;
        tcu::ConstPixelBufferAccess::getPixStencil
                  (stencilBuffer,(int)((long)uVar1 % (long)numSamplesPerFragment),
                   inputFragments[iVar2].pixelCoord.m_data[0],
                   inputFragments[iVar2].pixelCoord.m_data[1]);
        *pbVar7 = false;
      }
      pbVar7 = pbVar7 + 0x84;
    }
    break;
  case TESTFUNC_ALWAYS:
    pbVar7 = &this->m_sampleRegister[0].stencilPassed;
    for (uVar6 = 0; uVar6 != 0x40; uVar6 = uVar6 + 1) {
      if (((SampleData *)(pbVar7 + -1))->isAlive == true) {
        uVar1 = (ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff;
        iVar2 = (int)((long)uVar1 / (long)numSamplesPerFragment) + fragNdxOffset;
        tcu::ConstPixelBufferAccess::getPixStencil
                  (stencilBuffer,(int)((long)uVar1 % (long)numSamplesPerFragment),
                   inputFragments[iVar2].pixelCoord.m_data[0],
                   inputFragments[iVar2].pixelCoord.m_data[1]);
        *pbVar7 = true;
      }
      pbVar7 = pbVar7 + 0x84;
    }
    break;
  case TESTFUNC_LESS:
    pbVar7 = &this->m_sampleRegister[0].stencilPassed;
    for (uVar6 = 0; uVar6 != 0x40; uVar6 = uVar6 + 1) {
      if (((SampleData *)(pbVar7 + -1))->isAlive == true) {
        uVar1 = (ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff;
        iVar2 = (int)((long)uVar1 / (long)numSamplesPerFragment) + fragNdxOffset;
        uVar3 = tcu::ConstPixelBufferAccess::getPixStencil
                          (stencilBuffer,(int)((long)uVar1 % (long)numSamplesPerFragment),
                           inputFragments[iVar2].pixelCoord.m_data[0],
                           inputFragments[iVar2].pixelCoord.m_data[1]);
        *pbVar7 = (int)(stencilState->compMask & uVar4) < (int)(uVar3 & stencilState->compMask);
      }
      pbVar7 = pbVar7 + 0x84;
    }
    break;
  case TESTFUNC_LEQUAL:
    pbVar7 = &this->m_sampleRegister[0].stencilPassed;
    for (uVar6 = 0; uVar6 != 0x40; uVar6 = uVar6 + 1) {
      if (((SampleData *)(pbVar7 + -1))->isAlive == true) {
        uVar1 = (ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff;
        iVar2 = (int)((long)uVar1 / (long)numSamplesPerFragment) + fragNdxOffset;
        uVar3 = tcu::ConstPixelBufferAccess::getPixStencil
                          (stencilBuffer,(int)((long)uVar1 % (long)numSamplesPerFragment),
                           inputFragments[iVar2].pixelCoord.m_data[0],
                           inputFragments[iVar2].pixelCoord.m_data[1]);
        *pbVar7 = (int)(stencilState->compMask & uVar4) <= (int)(uVar3 & stencilState->compMask);
      }
      pbVar7 = pbVar7 + 0x84;
    }
    break;
  case TESTFUNC_GREATER:
    pbVar7 = &this->m_sampleRegister[0].stencilPassed;
    for (uVar6 = 0; uVar6 != 0x40; uVar6 = uVar6 + 1) {
      if (((SampleData *)(pbVar7 + -1))->isAlive == true) {
        uVar1 = (ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff;
        iVar2 = (int)((long)uVar1 / (long)numSamplesPerFragment) + fragNdxOffset;
        uVar3 = tcu::ConstPixelBufferAccess::getPixStencil
                          (stencilBuffer,(int)((long)uVar1 % (long)numSamplesPerFragment),
                           inputFragments[iVar2].pixelCoord.m_data[0],
                           inputFragments[iVar2].pixelCoord.m_data[1]);
        *pbVar7 = (int)(uVar3 & stencilState->compMask) < (int)(stencilState->compMask & uVar4);
      }
      pbVar7 = pbVar7 + 0x84;
    }
    break;
  case TESTFUNC_GEQUAL:
    pbVar7 = &this->m_sampleRegister[0].stencilPassed;
    for (uVar6 = 0; uVar6 != 0x40; uVar6 = uVar6 + 1) {
      if (((SampleData *)(pbVar7 + -1))->isAlive == true) {
        uVar1 = (ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff;
        iVar2 = (int)((long)uVar1 / (long)numSamplesPerFragment) + fragNdxOffset;
        uVar3 = tcu::ConstPixelBufferAccess::getPixStencil
                          (stencilBuffer,(int)((long)uVar1 % (long)numSamplesPerFragment),
                           inputFragments[iVar2].pixelCoord.m_data[0],
                           inputFragments[iVar2].pixelCoord.m_data[1]);
        *pbVar7 = (int)(uVar3 & stencilState->compMask) <= (int)(stencilState->compMask & uVar4);
      }
      pbVar7 = pbVar7 + 0x84;
    }
    break;
  case TESTFUNC_EQUAL:
    pbVar7 = &this->m_sampleRegister[0].stencilPassed;
    for (uVar6 = 0; uVar6 != 0x40; uVar6 = uVar6 + 1) {
      if (((SampleData *)(pbVar7 + -1))->isAlive == true) {
        uVar1 = (ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff;
        iVar2 = (int)((long)uVar1 / (long)numSamplesPerFragment) + fragNdxOffset;
        uVar3 = tcu::ConstPixelBufferAccess::getPixStencil
                          (stencilBuffer,(int)((long)uVar1 % (long)numSamplesPerFragment),
                           inputFragments[iVar2].pixelCoord.m_data[0],
                           inputFragments[iVar2].pixelCoord.m_data[1]);
        *pbVar7 = (stencilState->compMask & (uVar3 ^ uVar4)) == 0;
      }
      pbVar7 = pbVar7 + 0x84;
    }
    break;
  case TESTFUNC_NOTEQUAL:
    pbVar7 = &this->m_sampleRegister[0].stencilPassed;
    for (uVar6 = 0; uVar6 != 0x40; uVar6 = uVar6 + 1) {
      if (((SampleData *)(pbVar7 + -1))->isAlive == true) {
        uVar1 = (ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff;
        iVar2 = (int)((long)uVar1 / (long)numSamplesPerFragment) + fragNdxOffset;
        uVar3 = tcu::ConstPixelBufferAccess::getPixStencil
                          (stencilBuffer,(int)((long)uVar1 % (long)numSamplesPerFragment),
                           inputFragments[iVar2].pixelCoord.m_data[0],
                           inputFragments[iVar2].pixelCoord.m_data[1]);
        *pbVar7 = (stencilState->compMask & (uVar3 ^ uVar4)) != 0;
      }
      pbVar7 = pbVar7 + 0x84;
    }
  }
  return;
}

Assistant:

void FragmentProcessor::executeStencilCompare (int fragNdxOffset, int numSamplesPerFragment, const Fragment* inputFragments, const StencilState& stencilState, int numStencilBits, const tcu::ConstPixelBufferAccess& stencilBuffer)
{
#define SAMPLE_REGISTER_STENCIL_COMPARE(COMPARE_EXPRESSION)																					\
	for (int regSampleNdx = 0; regSampleNdx < SAMPLE_REGISTER_SIZE; regSampleNdx++)															\
	{																																		\
		if (m_sampleRegister[regSampleNdx].isAlive)																							\
		{																																	\
			int					fragSampleNdx		= regSampleNdx % numSamplesPerFragment;													\
			const Fragment&		frag				= inputFragments[fragNdxOffset + regSampleNdx/numSamplesPerFragment];					\
			int					stencilBufferValue	= stencilBuffer.getPixStencil(fragSampleNdx, frag.pixelCoord.x(), frag.pixelCoord.y());	\
			int					maskedRef			= stencilState.compMask & clampedStencilRef;											\
			int					maskedBuf			= stencilState.compMask & stencilBufferValue;											\
			DE_UNREF(maskedRef);																											\
			DE_UNREF(maskedBuf);																											\
																																			\
			m_sampleRegister[regSampleNdx].stencilPassed = (COMPARE_EXPRESSION);															\
		}																																	\
	}

	int clampedStencilRef = de::clamp(stencilState.ref, 0, (1<<numStencilBits)-1);

	switch (stencilState.func)
	{
		case TESTFUNC_NEVER:	SAMPLE_REGISTER_STENCIL_COMPARE(false)						break;
		case TESTFUNC_ALWAYS:	SAMPLE_REGISTER_STENCIL_COMPARE(true)						break;
		case TESTFUNC_LESS:		SAMPLE_REGISTER_STENCIL_COMPARE(maskedRef <  maskedBuf)		break;
		case TESTFUNC_LEQUAL:	SAMPLE_REGISTER_STENCIL_COMPARE(maskedRef <= maskedBuf)		break;
		case TESTFUNC_GREATER:	SAMPLE_REGISTER_STENCIL_COMPARE(maskedRef >  maskedBuf)		break;
		case TESTFUNC_GEQUAL:	SAMPLE_REGISTER_STENCIL_COMPARE(maskedRef >= maskedBuf)		break;
		case TESTFUNC_EQUAL:	SAMPLE_REGISTER_STENCIL_COMPARE(maskedRef == maskedBuf)		break;
		case TESTFUNC_NOTEQUAL:	SAMPLE_REGISTER_STENCIL_COMPARE(maskedRef != maskedBuf)		break;
		default:
			DE_ASSERT(false);
	}

#undef SAMPLE_REGISTER_STENCIL_COMPARE
}